

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thinlenscamera.hpp
# Opt level: O3

Ray * __thiscall
ThinlensCamera::sampleray
          (Ray *__return_storage_ptr__,ThinlensCamera *this,vec2f pos,Sampler *sampler)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined8 uVar5;
  undefined4 uVar8;
  undefined4 uVar9;
  float extraout_XMM0_Da;
  float fVar10;
  float extraout_XMM0_Db;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  float fVar20;
  float local_28;
  float fStack_24;
  
  (*sampler->_vptr_Sampler[5])(sampler);
  fVar12 = (this->lefthalf).z;
  fVar14 = (this->uphalf).z;
  local_28 = pos.x;
  fStack_24 = pos.y;
  fVar15 = 1.0 - (local_28 + local_28);
  fVar18 = 1.0 - (fStack_24 + fStack_24);
  uVar1 = (this->lefthalf).x;
  uVar6 = (this->lefthalf).y;
  uVar2 = (this->super_Camera).position.x;
  uVar7 = (this->super_Camera).position.y;
  uVar5 = *(undefined8 *)&(this->super_Camera).field_0x3c;
  uVar3 = (this->uphalf).x;
  uVar8 = (this->uphalf).y;
  auVar19._0_4_ = fVar14 * fVar14 + (float)uVar3 * (float)uVar3 + (float)uVar8 * (float)uVar8;
  auVar19._4_4_ = fVar12 * fVar12 + (float)uVar1 * (float)uVar1 + (float)uVar6 * (float)uVar6;
  auVar19._8_4_ = (float)uVar8 * (float)uVar8 + 0.0 + 0.0;
  auVar19._12_4_ = (float)uVar6 * (float)uVar6 + 0.0 + 0.0;
  auVar19 = sqrtps(auVar19,auVar19);
  auVar19 = divps(_DAT_00155730,auVar19);
  fVar20 = auVar19._0_4_;
  fVar10 = auVar19._4_4_;
  uVar4 = this->focaldistance;
  uVar9 = this->lensradius;
  fVar16 = (float)uVar9 *
           ((float)uVar1 * fVar10 * extraout_XMM0_Da + (float)uVar3 * fVar20 * extraout_XMM0_Db);
  fVar17 = (float)uVar9 *
           ((float)uVar8 * fVar20 * extraout_XMM0_Db + (float)uVar6 * fVar10 * extraout_XMM0_Da);
  fVar13 = (fVar10 * fVar12 * extraout_XMM0_Da + extraout_XMM0_Db * fVar14 * fVar20) * (float)uVar9;
  fVar20 = (this->super_Camera).position.z;
  fVar10 = (float)uVar4 * (fVar18 * (float)uVar3 + fVar15 * (float)uVar1 + (float)uVar5) - fVar16;
  fVar11 = (float)uVar4 *
           (fVar18 * (float)uVar8 + fVar15 * (float)uVar6 + (float)((ulong)uVar5 >> 0x20)) - fVar17;
  fVar12 = (fVar14 * fVar18 + fVar15 * fVar12 + *(float *)&this->field_0x44) * (float)uVar4 - fVar13
  ;
  fVar14 = 1.0 / SQRT(fVar12 * fVar12 + fVar10 * fVar10 + fVar11 * fVar11);
  (__return_storage_ptr__->origin).x = (float)uVar2 + fVar16;
  (__return_storage_ptr__->origin).y = (float)uVar7 + fVar17;
  (__return_storage_ptr__->origin).z = fVar20 + fVar13;
  (__return_storage_ptr__->dir).x = fVar14 * fVar10;
  (__return_storage_ptr__->dir).y = fVar14 * fVar11;
  (__return_storage_ptr__->dir).z = fVar12 * fVar14;
  return __return_storage_ptr__;
}

Assistant:

Ray sampleray(vec2f pos, Sampler& sampler) const {
		vec2f u = sampler.sampleUnitDisk();
		vec3f aperture_sample = lensradius * (u.x * normalized(lefthalf) + u.y * normalized(uphalf));
		vec3f focused_rel = (dir + (1-pos.x*2) * lefthalf + (1-pos.y*2) * uphalf) * focaldistance;
		return Ray(position + aperture_sample, normalized(focused_rel - aperture_sample));
	}